

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O3

ValueInfo * __thiscall
GlobOptBlockData::MergeArrayValueInfo
          (GlobOptBlockData *this,ValueType mergedValueType,ArrayValueInfo *toDataValueInfo,
          ArrayValueInfo *fromDataValueInfo,Sym *arraySym,
          BVSparse<Memory::JitArenaAllocator> *symsRequiringCompensation,
          BVSparse<Memory::JitArenaAllocator> *symsCreatedForMerge,bool isLoopBackEdge)

{
  code *pcVar1;
  anon_union_2_4_ea848c7b_for_ValueType_13 type;
  bool bVar2;
  BOOLEAN BVar3;
  undefined4 *puVar4;
  Loop *pLVar5;
  ArrayValueInfo *pAVar6;
  ValueInfo *this_00;
  StackSym *headSegmentSym;
  StackSym *headSegmentLengthSym;
  StackSym *lengthSym;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType mergedValueType_local;
  
  local_32[0] = mergedValueType.field_0;
  bVar2 = ValueType::IsAnyOptimizedArray((ValueType *)&local_32[0].field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,1099,"(mergedValueType.IsAnyOptimizedArray())",
                       "mergedValueType.IsAnyOptimizedArray()");
    if (!bVar2) goto LAB_004930fe;
    *puVar4 = 0;
  }
  if (toDataValueInfo == (ArrayValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x44c,"(toDataValueInfo)","toDataValueInfo");
    if (!bVar2) goto LAB_004930fe;
    *puVar4 = 0;
  }
  if (fromDataValueInfo == (ArrayValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x44d,"(fromDataValueInfo)","fromDataValueInfo");
    if (!bVar2) goto LAB_004930fe;
    *puVar4 = 0;
  }
  if (toDataValueInfo == fromDataValueInfo) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x44e,"(toDataValueInfo != fromDataValueInfo)",
                       "toDataValueInfo != fromDataValueInfo");
    if (!bVar2) goto LAB_004930fe;
    *puVar4 = 0;
  }
  if (arraySym == (Sym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x44f,"(arraySym)","arraySym");
    if (!bVar2) goto LAB_004930fe;
    *puVar4 = 0;
  }
  pLVar5 = this->globOpt->prePassLoop;
  if ((symsRequiringCompensation == (BVSparse<Memory::JitArenaAllocator> *)0x0) !=
      (pLVar5 != (Loop *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x450,"(!symsRequiringCompensation == this->globOpt->IsLoopPrePass())",
                       "!symsRequiringCompensation == this->globOpt->IsLoopPrePass()");
    if (!bVar2) goto LAB_004930fe;
    *puVar4 = 0;
    pLVar5 = this->globOpt->prePassLoop;
  }
  if ((symsCreatedForMerge == (BVSparse<Memory::JitArenaAllocator> *)0x0) != (pLVar5 != (Loop *)0x0)
     ) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x451,"(!symsCreatedForMerge == this->globOpt->IsLoopPrePass())",
                       "!symsCreatedForMerge == this->globOpt->IsLoopPrePass()");
    if (!bVar2) goto LAB_004930fe;
    *puVar4 = 0;
  }
  headSegmentSym = toDataValueInfo->headSegmentSym;
  if ((headSegmentSym == (StackSym *)0x0) || (fromDataValueInfo->headSegmentSym == (StackSym *)0x0))
  {
LAB_00492c98:
    headSegmentSym = (StackSym *)0x0;
  }
  else if (headSegmentSym != fromDataValueInfo->headSegmentSym) {
    if (this->globOpt->prePassLoop != (Loop *)0x0 || isLoopBackEdge) goto LAB_00492c98;
    if (symsRequiringCompensation == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                         ,0x463,"(symsRequiringCompensation)","symsRequiringCompensation");
      if (!bVar2) goto LAB_004930fe;
      *puVar4 = 0;
    }
    BVSparse<Memory::JitArenaAllocator>::Set(symsRequiringCompensation,arraySym->m_id);
    if (symsCreatedForMerge == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                         ,0x465,"(symsCreatedForMerge)","symsCreatedForMerge");
      if (!bVar2) goto LAB_004930fe;
      *puVar4 = 0;
    }
    BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                      (symsCreatedForMerge,(toDataValueInfo->headSegmentSym->super_Sym).m_id);
    if (BVar3 == '\0') {
      headSegmentSym = StackSym::New(TyUint64,this->globOpt->func);
      BVSparse<Memory::JitArenaAllocator>::Set(symsCreatedForMerge,(headSegmentSym->super_Sym).m_id)
      ;
    }
    else {
      headSegmentSym = toDataValueInfo->headSegmentSym;
    }
  }
  headSegmentLengthSym = toDataValueInfo->headSegmentLengthSym;
  if ((headSegmentLengthSym == (StackSym *)0x0) ||
     (fromDataValueInfo->headSegmentLengthSym == (StackSym *)0x0)) {
LAB_00492cd5:
    headSegmentLengthSym = (StackSym *)0x0;
  }
  else if (headSegmentLengthSym != fromDataValueInfo->headSegmentLengthSym) {
    if (this->globOpt->prePassLoop != (Loop *)0x0 || isLoopBackEdge) goto LAB_00492cd5;
    if (symsRequiringCompensation == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                         ,0x47e,"(symsRequiringCompensation)","symsRequiringCompensation");
      if (!bVar2) goto LAB_004930fe;
      *puVar4 = 0;
    }
    BVSparse<Memory::JitArenaAllocator>::Set(symsRequiringCompensation,arraySym->m_id);
    if (symsCreatedForMerge == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                         ,0x480,"(symsCreatedForMerge)","symsCreatedForMerge");
      if (!bVar2) goto LAB_004930fe;
      *puVar4 = 0;
    }
    BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                      (symsCreatedForMerge,(toDataValueInfo->headSegmentLengthSym->super_Sym).m_id);
    if (BVar3 == '\0') {
      headSegmentLengthSym = StackSym::New(TyUint32,this->globOpt->func);
      BVSparse<Memory::JitArenaAllocator>::Set
                (symsCreatedForMerge,(headSegmentLengthSym->super_Sym).m_id);
    }
    else {
      headSegmentLengthSym = toDataValueInfo->headSegmentLengthSym;
    }
  }
  lengthSym = toDataValueInfo->lengthSym;
  if ((lengthSym == (StackSym *)0x0) || (fromDataValueInfo->lengthSym == (StackSym *)0x0)) {
LAB_00492d0e:
    lengthSym = (StackSym *)0x0;
  }
  else {
    if (lengthSym == fromDataValueInfo->lengthSym) goto LAB_00492d1b;
    if (this->globOpt->prePassLoop != (Loop *)0x0 || isLoopBackEdge) goto LAB_00492d0e;
    if (symsRequiringCompensation == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                         ,0x499,"(symsRequiringCompensation)","symsRequiringCompensation");
      if (!bVar2) goto LAB_004930fe;
      *puVar4 = 0;
    }
    BVSparse<Memory::JitArenaAllocator>::Set(symsRequiringCompensation,arraySym->m_id);
    if (symsCreatedForMerge == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                         ,0x49b,"(symsCreatedForMerge)","symsCreatedForMerge");
      if (!bVar2) {
LAB_004930fe:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                      (symsCreatedForMerge,(toDataValueInfo->lengthSym->super_Sym).m_id);
    if (BVar3 == '\0') {
      lengthSym = StackSym::New(TyUint32,this->globOpt->func);
      BVSparse<Memory::JitArenaAllocator>::Set(symsCreatedForMerge,(lengthSym->super_Sym).m_id);
      goto LAB_00492d1b;
    }
    lengthSym = toDataValueInfo->lengthSym;
  }
  if ((headSegmentSym == (StackSym *)0x0 && headSegmentLengthSym == (StackSym *)0x0) &&
      lengthSym == (StackSym *)0x0) {
    if (symsRequiringCompensation != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      BVSparse<Memory::JitArenaAllocator>::Clear(symsRequiringCompensation,arraySym->m_id);
    }
    type = local_32[0];
    this_00 = (ValueInfo *)new<Memory::JitArenaAllocator>(0x18,this->globOpt->alloc,0x3eba5c);
    ValueInfo::ValueInfo(this_00,(ValueType)type.field_0,Generic);
    return this_00;
  }
LAB_00492d1b:
  pAVar6 = ArrayValueInfo::New(this->globOpt->alloc,(ValueType)local_32[0].field_0,headSegmentSym,
                               headSegmentLengthSym,lengthSym,(Sym *)0x0);
  return &pAVar6->super_ValueInfo;
}

Assistant:

ValueInfo *GlobOptBlockData::MergeArrayValueInfo(
    const ValueType mergedValueType,
    const ArrayValueInfo *const toDataValueInfo,
    const ArrayValueInfo *const fromDataValueInfo,
    Sym *const arraySym,
    BVSparse<JitArenaAllocator> *const symsRequiringCompensation,
    BVSparse<JitArenaAllocator> *const symsCreatedForMerge,
    bool isLoopBackEdge)
{
    Assert(mergedValueType.IsAnyOptimizedArray());
    Assert(toDataValueInfo);
    Assert(fromDataValueInfo);
    Assert(toDataValueInfo != fromDataValueInfo);
    Assert(arraySym);
    Assert(!symsRequiringCompensation == this->globOpt->IsLoopPrePass());
    Assert(!symsCreatedForMerge == this->globOpt->IsLoopPrePass());

    // Merge the segment and segment length syms. If we have the segment and/or the segment length syms available on both sides
    // but in different syms, create a new sym and record that the array sym requires compensation. Compensation will be
    // inserted later to initialize this new sym from all predecessors of the merged block.

    StackSym *newHeadSegmentSym = nullptr;
    if(toDataValueInfo->HeadSegmentSym() && fromDataValueInfo->HeadSegmentSym())
    {
        if(toDataValueInfo->HeadSegmentSym() == fromDataValueInfo->HeadSegmentSym())
        {
            newHeadSegmentSym = toDataValueInfo->HeadSegmentSym();
        }
        else
        {
            if (!this->globOpt->IsLoopPrePass() && !isLoopBackEdge)
            {
                // Adding compensation code in the prepass won't help, as the symstores would again be different in the main pass.
                Assert(symsRequiringCompensation);
                symsRequiringCompensation->Set(arraySym->m_id);
                Assert(symsCreatedForMerge);
                if (symsCreatedForMerge->Test(toDataValueInfo->HeadSegmentSym()->m_id))
                {
                    newHeadSegmentSym = toDataValueInfo->HeadSegmentSym();
                }
                else
                {
                    newHeadSegmentSym = StackSym::New(TyMachPtr, this->globOpt->func);
                    symsCreatedForMerge->Set(newHeadSegmentSym->m_id);
                }
            }
        }
    }

    StackSym *newHeadSegmentLengthSym = nullptr;
    if(toDataValueInfo->HeadSegmentLengthSym() && fromDataValueInfo->HeadSegmentLengthSym())
    {
        if(toDataValueInfo->HeadSegmentLengthSym() == fromDataValueInfo->HeadSegmentLengthSym())
        {
            newHeadSegmentLengthSym = toDataValueInfo->HeadSegmentLengthSym();
        }
        else
        {
            if (!this->globOpt->IsLoopPrePass() && !isLoopBackEdge)
            {
                Assert(symsRequiringCompensation);
                symsRequiringCompensation->Set(arraySym->m_id);
                Assert(symsCreatedForMerge);
                if (symsCreatedForMerge->Test(toDataValueInfo->HeadSegmentLengthSym()->m_id))
                {
                    newHeadSegmentLengthSym = toDataValueInfo->HeadSegmentLengthSym();
                }
                else
                {
                    newHeadSegmentLengthSym = StackSym::New(TyUint32, this->globOpt->func);
                    symsCreatedForMerge->Set(newHeadSegmentLengthSym->m_id);
                }
            }
        }
    }

    StackSym *newLengthSym = nullptr;
    if(toDataValueInfo->LengthSym() && fromDataValueInfo->LengthSym())
    {
        if(toDataValueInfo->LengthSym() == fromDataValueInfo->LengthSym())
        {
            newLengthSym = toDataValueInfo->LengthSym();
        }
        else
        {
            if (!this->globOpt->IsLoopPrePass() && !isLoopBackEdge)
            {
                Assert(symsRequiringCompensation);
                symsRequiringCompensation->Set(arraySym->m_id);
                Assert(symsCreatedForMerge);
                if (symsCreatedForMerge->Test(toDataValueInfo->LengthSym()->m_id))
                {
                    newLengthSym = toDataValueInfo->LengthSym();
                }
                else
                {
                    newLengthSym = StackSym::New(TyUint32, this->globOpt->func);
                    symsCreatedForMerge->Set(newLengthSym->m_id);
                }
            }
        }
    }

    if(newHeadSegmentSym || newHeadSegmentLengthSym || newLengthSym)
    {
        return ArrayValueInfo::New(this->globOpt->alloc, mergedValueType, newHeadSegmentSym, newHeadSegmentLengthSym, newLengthSym);
    }

    if(symsRequiringCompensation)
    {
        symsRequiringCompensation->Clear(arraySym->m_id);
    }
    return ValueInfo::New(this->globOpt->alloc, mergedValueType);
}